

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O1

void __thiscall
TEST_TestFailure_BitsEqual32Bit_Test::testBody(TEST_TestFailure_BitsEqual32Bit_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  undefined1 auStack_88 [16];
  BitsEqualFailure f;
  
  pUVar1 = (this->super_TEST_GROUP_CppUTestGroupTestFailure).test;
  SimpleString::SimpleString((SimpleString *)auStack_88,"");
  BitsEqualFailure::BitsEqualFailure
            (&f,pUVar1,"fail.cpp",2,1,3,0xffffffff,4,(SimpleString *)auStack_88);
  SimpleString::~SimpleString((SimpleString *)auStack_88);
  pUVar1 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)auStack_88);
  pcVar2 = SimpleString::asCharString((SimpleString *)auStack_88);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,
             "expected <00000000 00000000 00000000 00000001>\n\tbut was  <00000000 00000000 00000000 00000011>"
             ,pcVar2,"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
             ,0x1a5,pTVar3);
  SimpleString::~SimpleString((SimpleString *)auStack_88);
  TestFailure::~TestFailure(&f.super_TestFailure);
  return;
}

Assistant:

TEST(TestFailure, BitsEqual32Bit)
{
    BitsEqualFailure f(test, failFileName, failLineNumber, 0x00000001, 0x00000003, 0xFFFFFFFF, 4*8/CPPUTEST_CHAR_BIT, "");
    FAILURE_EQUAL("expected <00000000 00000000 00000000 00000001>\n\tbut was  <00000000 00000000 00000000 00000011>", f);
}